

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlHandle __thiscall despot::util::tinyxml::TiXmlHandle::ChildElement(TiXmlHandle *this,int count)

{
  TiXmlElement *this_00;
  int in_EDX;
  undefined4 in_register_00000034;
  int iVar1;
  
  if (*(TiXmlNode **)CONCAT44(in_register_00000034,count) != (TiXmlNode *)0x0) {
    this_00 = TiXmlNode::FirstChildElement(*(TiXmlNode **)CONCAT44(in_register_00000034,count));
    for (iVar1 = 0; (this_00 != (TiXmlElement *)0x0 && (iVar1 < in_EDX)); iVar1 = iVar1 + 1) {
      this_00 = TiXmlNode::NextSiblingElement(&this_00->super_TiXmlNode);
    }
    if (this_00 != (TiXmlElement *)0x0) goto LAB_00178f25;
  }
  this_00 = (TiXmlElement *)0x0;
LAB_00178f25:
  this->node = &this_00->super_TiXmlNode;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::ChildElement(int count) const {
	if (node) {
		int i;
		TiXmlElement* child = node->FirstChildElement();
		for (i = 0; child && i < count;
			child = child->NextSiblingElement(), ++i) {
			// nothing
		}
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}